

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O1

bool __thiscall
Isotropic::Scatter(Isotropic *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,
                  Ray *ray_out)

{
  float fVar1;
  Texture *pTVar2;
  float fVar3;
  float fVar4;
  float local_3c;
  undefined4 uStack_38;
  float fStack_34;
  
  random_in_unit_disk();
  fVar1 = ray_in->m_time;
  fVar3 = (hit_record->m_point).e[1];
  fVar4 = (hit_record->m_point).e[2];
  (ray_out->m_origin).e[0] = (hit_record->m_point).e[0];
  (ray_out->m_origin).e[1] = fVar3;
  (ray_out->m_origin).e[2] = fVar4;
  (ray_out->m_direction).e[0] = local_3c;
  *(ulong *)((ray_out->m_direction).e + 1) = CONCAT44(fStack_34,uStack_38);
  ray_out->m_time = fVar1;
  pTVar2 = (this->super_Material).m_albedo;
  (*pTVar2->_vptr_Texture[2])
            ((ulong)(uint)hit_record->m_u,hit_record->m_v,&local_3c,pTVar2,&hit_record->m_point);
  attenuation->e[2] = fStack_34;
  *(ulong *)attenuation->e = CONCAT44(uStack_38,local_3c);
  return true;
}

Assistant:

bool
Isotropic::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
	ray_out		= Ray(hit_record.m_point, random_in_unit_disk(), ray_in.GetTime());
	attenuation = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);

	return true;
}